

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall
cmMakefile::HaveStandardAvailable(cmMakefile *this,cmTarget *target,string *lang,string *feature)

{
  bool bVar1;
  bool local_31;
  string *feature_local;
  string *lang_local;
  cmTarget *target_local;
  cmMakefile *this_local;
  
  bVar1 = std::operator==(lang,"C");
  if (bVar1) {
    local_31 = HaveCStandardAvailable(this,target,feature);
  }
  else {
    local_31 = HaveCxxStandardAvailable(this,target,feature);
  }
  return local_31;
}

Assistant:

bool cmMakefile::HaveStandardAvailable(cmTarget const* target,
                                       std::string const& lang,
                                       const std::string& feature) const
{
  return lang == "C" ? this->HaveCStandardAvailable(target, feature)
                     : this->HaveCxxStandardAvailable(target, feature);
}